

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_ecmult.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint64_t *puVar1;
  secp256k1_scratch_space *__ptr;
  int iVar2;
  int iVar3;
  char *__nptr;
  long lVar4;
  secp256k1_context *psVar5;
  secp256k1_scalar *psVar6;
  secp256k1_gej *r;
  code *pcVar7;
  int iVar8;
  long lVar9;
  size_t __size;
  size_t count;
  int in_stack_fffffffffffffe98;
  int local_160;
  uchar local_15c [7];
  undefined1 local_155;
  undefined2 local_154;
  secp256k1_gej *local_150;
  secp256k1_ge *local_148;
  secp256k1_scalar *local_140;
  secp256k1_scalar *local_138;
  bench_data data;
  secp256k1_sha256 local_c8;
  uchar buf [32];
  
  __nptr = getenv("SECP256K1_BENCH_ITERS");
  if (__nptr == (char *)0x0) {
    iVar3 = 10000;
  }
  else {
    lVar4 = strtol(__nptr,(char **)0x0,0);
    iVar3 = (int)lVar4;
  }
  data.ecmult_multi = secp256k1_ecmult_multi_var;
  if (1 < argc) {
    iVar2 = have_flag(argc,argv,"-h");
    if (((iVar2 != 0) || (iVar2 = have_flag(argc,argv,"--help"), iVar2 != 0)) ||
       (iVar2 = have_flag(argc,argv,"help"), iVar2 != 0)) {
      help(argv);
      return 0;
    }
    iVar2 = have_flag(argc,argv,"pippenger_wnaf");
    if (iVar2 == 0) {
      iVar2 = have_flag(argc,argv,"strauss_wnaf");
      if (iVar2 == 0) {
        iVar2 = have_flag(argc,argv,"simple");
        if (iVar2 == 0) {
          fprintf(_stderr,"%s: unrecognized argument \'%s\'.\n\n",*argv,argv[1]);
          help(argv);
          return 1;
        }
        puts("Using simple algorithm:");
      }
      else {
        puts("Using strauss_wnaf:");
        data.ecmult_multi = secp256k1_ecmult_strauss_batch_single;
      }
    }
    else {
      puts("Using pippenger_wnaf:");
      data.ecmult_multi = secp256k1_ecmult_pippenger_batch_single;
    }
  }
  psVar5 = secp256k1_context_create(1);
  data.ctx = psVar5;
  iVar2 = have_flag(argc,argv,"simple");
  if (iVar2 == 0) {
    data.scratch = (secp256k1_scratch_space *)checked_malloc(&psVar5->error_callback,0x4580070);
    if (data.scratch != (secp256k1_scratch_space *)0x0) {
      (data.scratch)->alloc_size = 0;
      builtin_memcpy((data.scratch)->magic,"scratch",8);
      (data.scratch)->data = data.scratch + 1;
      (data.scratch)->max_size = 0x4580050;
    }
  }
  else {
    data.scratch = (secp256k1_scratch_space *)0x0;
  }
  local_138 = (secp256k1_scalar *)malloc(0x100000);
  data.scalars = local_138;
  psVar6 = (secp256k1_scalar *)malloc(0x100000);
  data.seckeys = psVar6;
  local_148 = (secp256k1_ge *)malloc(0x2c0000);
  data.pubkeys = local_148;
  r = (secp256k1_gej *)malloc(0x400000);
  __size = (long)iVar3 * 0x80 + 0x80;
  data.pubkeys_gej = r;
  data.expected_output = (secp256k1_gej *)malloc(__size);
  data.output = (secp256k1_gej *)malloc(__size);
  r->infinity = 0;
  (r->x).n[4] = 0x79be667ef9dc;
  (r->x).n[2] = 0xe870b07029bfc;
  (r->x).n[3] = 0xbbac55a06295c;
  (r->x).n[0] = 0x2815b16f81798;
  (r->x).n[1] = 0xdb2dce28d959f;
  (r->y).n[4] = 0x483ada7726a3;
  (r->y).n[2] = 0xe1108a8fd17b4;
  (r->y).n[3] = 0xc4655da4fbfc0;
  (r->y).n[0] = 0x7d08ffb10d4b8;
  (r->y).n[1] = 0x48a68554199c4;
  (r->z).n[0] = 1;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  psVar6->d[0] = 1;
  psVar6->d[3] = 0;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  psVar6->d[1] = 0;
  psVar6->d[2] = 0;
  lVar9 = 0;
  lVar4 = 0;
  local_150 = r;
  local_140 = psVar6;
  while( true ) {
    if (lVar9 == 0x100000) {
      secp256k1_ge_set_all_gej_var(local_148,local_150,0x8000);
      printf("%-30s,%-15s,%-15s,%-15s\n","Benchmark","    Min(us)    ","    Avg(us)    ",
             "    Max(us)    ");
      putchar(10);
      data.offset1 = 0x2481;
      data.offset2 = 0xf49;
      local_c8.s._0_5_ = 0x6c756d6365;
      local_c8.s[1]._1_2_ = 0x5f74;
      local_c8.s[1]._3_1_ = 0x67;
      local_c8.s[2]._0_2_ = 0x6e65;
      local_c8.s[2]._2_1_ = 0;
      run_benchmark((char *)&local_c8,bench_ecmult_gen,bench_ecmult_setup,bench_ecmult_gen_teardown,
                    &data,iVar3,in_stack_fffffffffffffe98);
      local_c8.s[2]._0_2_ = 0x6e6f;
      local_c8.s[2]._2_1_ = 0x73;
      local_c8.s[2]._3_1_ = 0x74;
      local_c8.s[3] = local_c8.s[3] & 0xffffff00;
      local_c8.s._0_5_ = 0x6c756d6365;
      local_c8.s[1]._1_2_ = 0x5f74;
      local_c8.s[1]._3_1_ = 99;
      run_benchmark((char *)&local_c8,bench_ecmult_const,bench_ecmult_setup,
                    bench_ecmult_const_teardown,&data,iVar3,in_stack_fffffffffffffe98);
      local_c8.s._0_5_ = 0x6c756d6365;
      local_c8.s[1]._1_2_ = 0x5f74;
      local_c8.s[1]._3_1_ = 0x31;
      local_c8.s[2]._0_2_ = 0x70;
      run_benchmark((char *)&local_c8,bench_ecmult_1p,bench_ecmult_setup,bench_ecmult_1p_teardown,
                    &data,iVar3,in_stack_fffffffffffffe98);
      local_c8.s[2]._0_2_ = 0x5f70;
      local_c8.s[2]._2_1_ = 0x67;
      local_c8.s[2]._3_1_ = 0;
      local_c8.s._0_5_ = 0x6c756d6365;
      local_c8.s[1]._1_2_ = 0x5f74;
      local_c8.s[1]._3_1_ = 0x30;
      run_benchmark((char *)&local_c8,bench_ecmult_0p_g,bench_ecmult_setup,
                    bench_ecmult_0p_g_teardown,&data,iVar3,in_stack_fffffffffffffe98);
      local_c8.s[2]._0_2_ = 0x5f70;
      local_c8.s[2]._2_1_ = 0x67;
      local_c8.s[2]._3_1_ = 0;
      local_c8.s._0_5_ = 0x6c756d6365;
      local_c8.s[1]._1_2_ = 0x5f74;
      local_c8.s[1]._3_1_ = 0x31;
      pcVar7 = bench_ecmult_1p_g_teardown;
      run_benchmark((char *)&local_c8,bench_ecmult_1p_g,bench_ecmult_setup,
                    bench_ecmult_1p_g_teardown,&data,iVar3 * 2,in_stack_fffffffffffffe98);
      for (count = 1; count != 9; count = count + 1) {
        run_ecmult_multi_bench(&data,count,iVar3,(int)pcVar7);
      }
      if (2 < iVar3) {
        for (iVar2 = 0; iVar2 != 0xc; iVar2 = iVar2 + 1) {
          for (iVar8 = 9; iVar8 != 0x11; iVar8 = iVar8 + 1) {
            run_ecmult_multi_bench(&data,(ulong)(uint)(iVar8 << ((byte)iVar2 & 0x1f)),iVar3,iVar2);
          }
        }
      }
      __ptr = data.scratch;
      if (data.scratch != (secp256k1_scratch_space *)0x0) {
        iVar3 = secp256k1_memcmp_var(data.scratch,"scratch",8);
        if (iVar3 == 0) {
          free(__ptr);
        }
        else {
          (*((data.ctx)->error_callback).fn)
                    ("invalid scratch space",((data.ctx)->error_callback).data);
        }
      }
      secp256k1_context_destroy(data.ctx);
      free(data.scalars);
      free(data.pubkeys);
      free(data.pubkeys_gej);
      free(data.seckeys);
      free(data.output);
      free(data.expected_output);
      return 0;
    }
    puVar1 = local_138->d;
    local_160 = 0;
    builtin_memcpy(local_15c,"ecmult",6);
    local_15c[6] = (uchar)lVar4;
    local_155 = (undefined1)((ulong)lVar4 >> 8);
    local_154 = 0;
    local_c8.s._0_5_ = 0x856a09e667;
    local_c8.s[1]._1_2_ = 0x67ae;
    local_c8.s[1]._3_1_ = 0xbb;
    local_c8.s[2]._0_2_ = 0xf372;
    local_c8.s[2]._2_1_ = 0x6e;
    local_c8.s[2]._3_1_ = 0x3c;
    local_c8.s[3] = 0xa54ff53a;
    local_c8.s[4] = 0x510e527f;
    local_c8.s[5] = 0x9b05688c;
    local_c8.s[6] = 0x1f83d9ab;
    local_c8.s[7] = 0x5be0cd19;
    local_c8.bytes = 0;
    secp256k1_sha256_write(&local_c8,local_15c,10);
    secp256k1_sha256_finalize(&local_c8,buf);
    secp256k1_scalar_set_b32((secp256k1_scalar *)((long)puVar1 + lVar9),buf,&local_160);
    if (local_160 != 0) break;
    if (lVar9 != 0) {
      secp256k1_gej_double_var(r,r + -1,(secp256k1_fe *)0x0);
      psVar6 = (secp256k1_scalar *)((long)local_140[-1].d + lVar9);
      secp256k1_scalar_add((secp256k1_scalar *)((long)local_140->d + lVar9),psVar6,psVar6);
    }
    lVar4 = lVar4 + 1;
    lVar9 = lVar9 + 0x20;
    r = r + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/bench_ecmult.c"
          ,0xf3,"test condition failed: !overflow");
  abort();
}

Assistant:

int main(int argc, char **argv) {
    bench_data data;
    int i, p;
    size_t scratch_size;

    int iters = get_iters(10000);

    data.ecmult_multi = secp256k1_ecmult_multi_var;

    if (argc > 1) {
        if(have_flag(argc, argv, "-h")
           || have_flag(argc, argv, "--help")
           || have_flag(argc, argv, "help")) {
            help(argv);
            return EXIT_SUCCESS;
        } else if(have_flag(argc, argv, "pippenger_wnaf")) {
            printf("Using pippenger_wnaf:\n");
            data.ecmult_multi = secp256k1_ecmult_pippenger_batch_single;
        } else if(have_flag(argc, argv, "strauss_wnaf")) {
            printf("Using strauss_wnaf:\n");
            data.ecmult_multi = secp256k1_ecmult_strauss_batch_single;
        } else if(have_flag(argc, argv, "simple")) {
            printf("Using simple algorithm:\n");
        } else {
            fprintf(stderr, "%s: unrecognized argument '%s'.\n\n", argv[0], argv[1]);
            help(argv);
            return EXIT_FAILURE;
        }
    }

    data.ctx = secp256k1_context_create(SECP256K1_CONTEXT_NONE);
    scratch_size = secp256k1_strauss_scratch_size(POINTS) + STRAUSS_SCRATCH_OBJECTS*16;
    if (!have_flag(argc, argv, "simple")) {
        data.scratch = secp256k1_scratch_space_create(data.ctx, scratch_size);
    } else {
        data.scratch = NULL;
    }

    /* Allocate stuff */
    data.scalars = malloc(sizeof(secp256k1_scalar) * POINTS);
    data.seckeys = malloc(sizeof(secp256k1_scalar) * POINTS);
    data.pubkeys = malloc(sizeof(secp256k1_ge) * POINTS);
    data.pubkeys_gej = malloc(sizeof(secp256k1_gej) * POINTS);
    data.expected_output = malloc(sizeof(secp256k1_gej) * (iters + 1));
    data.output = malloc(sizeof(secp256k1_gej) * (iters + 1));

    /* Generate a set of scalars, and private/public keypairs. */
    secp256k1_gej_set_ge(&data.pubkeys_gej[0], &secp256k1_ge_const_g);
    secp256k1_scalar_set_int(&data.seckeys[0], 1);
    for (i = 0; i < POINTS; ++i) {
        generate_scalar(i, &data.scalars[i]);
        if (i) {
            secp256k1_gej_double_var(&data.pubkeys_gej[i], &data.pubkeys_gej[i - 1], NULL);
            secp256k1_scalar_add(&data.seckeys[i], &data.seckeys[i - 1], &data.seckeys[i - 1]);
        }
    }
    secp256k1_ge_set_all_gej_var(data.pubkeys, data.pubkeys_gej, POINTS);


    print_output_table_header_row();
    /* Initialize offset1 and offset2 */
    hash_into_offset(&data, 0);
    run_ecmult_bench(&data, iters);

    for (i = 1; i <= 8; ++i) {
        run_ecmult_multi_bench(&data, i, 1, iters);
    }

    /* This is disabled with low count of iterations because the loop runs 77 times even with iters=1
    * and the higher it goes the longer the computation takes(more points)
    * So we don't run this benchmark with low iterations to prevent slow down */
     if (iters > 2) {
        for (p = 0; p <= 11; ++p) {
            for (i = 9; i <= 16; ++i) {
                run_ecmult_multi_bench(&data, i << p, 1, iters);
            }
        }
    }

    if (data.scratch != NULL) {
        secp256k1_scratch_space_destroy(data.ctx, data.scratch);
    }
    secp256k1_context_destroy(data.ctx);
    free(data.scalars);
    free(data.pubkeys);
    free(data.pubkeys_gej);
    free(data.seckeys);
    free(data.output);
    free(data.expected_output);

    return EXIT_SUCCESS;
}